

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O0

void __thiscall TestRegenerateCmakeHeader::Run(TestRegenerateCmakeHeader *this)

{
  byte bVar1;
  runtime_error *this_00;
  __type v;
  ostringstream oss;
  string expectedOutput;
  Configuration config;
  undefined7 in_stack_fffffffffffffc00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  ostringstream local_3c0 [8];
  Configuration *in_stack_fffffffffffffc48;
  ostream *in_stack_fffffffffffffc50;
  Configuration *in_stack_fffffffffffffd70;
  allocator local_241;
  string local_240 [48];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [464];
  
  Configuration::Configuration(in_stack_fffffffffffffd70);
  std::__cxx11::string::operator=(local_210,"My Company");
  std::__cxx11::string::operator=(local_1f0,"My\nmultiline\nlicense.");
  std::__cxx11::string::operator=(local_1d0,"AUTOGENERATED");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_240,
             "#\n# Copyright (c) My Company. All rights reserved.\n# My\n# multiline\n# license.\n#\n\n# AUTOGENERATED - do not edit, your changes will be lost\n# If you must edit, remove these two lines to avoid regeneration\n\n"
             ,&local_241);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::ostringstream::ostringstream(local_3c0);
  RegenerateCmakeHeader(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc18);
  if ((bVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_3c0);
  std::__cxx11::string::~string(local_240);
  Configuration::~Configuration((Configuration *)CONCAT17(bVar1,in_stack_fffffffffffffc00));
  return;
}

Assistant:

TEST(RegenerateCmakeHeader) {
  Configuration config;
  config.companyName = "My Company";
  config.licenseString = "My\nmultiline\nlicense.";
  config.regenTag = "AUTOGENERATED";

  const std::string expectedOutput(
      "#\n"
      "# Copyright (c) My Company. All rights reserved.\n"
      "# My\n"
      "# multiline\n"
      "# license.\n"
      "#\n"
      "\n"
      "# AUTOGENERATED - do not edit, your changes will be lost\n"
      "# If you must edit, remove these two lines to avoid regeneration\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeHeader(oss, config);

  ASSERT(oss.str() == expectedOutput);
}